

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.h
# Opt level: O2

void __thiscall sptk::GaussianMixtureModeling::Buffer::~Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00117b58;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            (&this->precisions_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->gconsts_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->d_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

virtual ~Buffer() {
    }